

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_13::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  int iVar1;
  Var *this_00;
  string_view name_00;
  
  this_00 = (Var *)name._M_str;
  if (this_00->type_ == Name) {
    if ((NameApplier *)(this_00->field_2).name_._M_string_length != this) {
LAB_00134573:
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/apply-names.cc"
                    ,0x8f,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(std::string_view, Var *)"
                   );
    }
    if (this != (NameApplier *)0x0) {
      iVar1 = bcmp((char *)name._M_len,(this_00->field_2).name_._M_dataplus._M_p,(size_t)this);
      if (iVar1 != 0) goto LAB_00134573;
    }
  }
  else if (this != (NameApplier *)0x0) {
    name_00._M_str = (char *)name._M_len;
    name_00._M_len = (size_t)this;
    Var::set_name(this_00,name_00);
    return;
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(std::string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}